

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_get_multiset_Test::TestBody(ObjectTest_basic_get_multiset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  AssertHelper local_938 [8];
  Message local_930 [8];
  multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  local_928;
  multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  local_8f0;
  bool local_8b9;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_888 [8];
  Message local_880 [8];
  multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_878;
  multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_840;
  bool local_809;
  undefined1 local_808 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_7d8 [8];
  Message local_7d0 [8];
  multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_> local_7c8;
  multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_> local_790;
  bool local_759;
  undefined1 local_758 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_728 [8];
  Message local_720 [8];
  multiset<double,_std::less<double>,_std::allocator<double>_> local_718;
  multiset<double,_std::less<double>,_std::allocator<double>_> local_6e0;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_678 [8];
  Message local_670 [8];
  multiset<float,_std::less<float>,_std::allocator<float>_> local_668;
  multiset<float,_std::less<float>,_std::allocator<float>_> local_630;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_5c8 [8];
  Message local_5c0 [8];
  multiset<long,_std::less<long>,_std::allocator<long>_> local_5b8;
  multiset<long,_std::less<long>,_std::allocator<long>_> local_580;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_518 [8];
  Message local_510 [8];
  multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_> local_508;
  multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_> local_4d0;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_468 [8];
  Message local_460 [8];
  multiset<long,_std::less<long>,_std::allocator<long>_> local_458;
  multiset<long,_std::less<long>,_std::allocator<long>_> local_420;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_3b8 [8];
  Message local_3b0 [8];
  multiset<int,_std::less<int>,_std::allocator<int>_> local_3a8;
  multiset<int,_std::less<int>,_std::allocator<int>_> local_370;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_308 [8];
  Message local_300 [8];
  multiset<short,_std::less<short>,_std::allocator<short>_> local_2f8;
  multiset<short,_std::less<short>,_std::allocator<short>_> local_2c0;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_258 [8];
  Message local_250 [8];
  multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> local_248;
  multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> local_210;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1a8 [8];
  Message local_1a0 [8];
  multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> local_198;
  multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> local_160;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f8 [8];
  Message local_f0 [24];
  multiset<bool,_std::less<bool>,_std::allocator<bool>_> local_d8;
  multiset<bool,_std::less<bool>,_std::allocator<bool>_> local_a0;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  object obj;
  ObjectTest_basic_get_multiset_Test *this_local;
  
  jessilib::object::object((object *)&gtest_ar_.message_);
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_d8._M_t._M_impl._0_8_ = 0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>::multiset(&local_d8);
  jessilib::object::
  get<std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>,_std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>,_nullptr>
            (&local_a0,(object *)&gtest_ar_.message_,&local_d8);
  local_69 = std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>::empty(&local_a0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>::~multiset(&local_a0);
  std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>::~multiset(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_68,
               "obj.get<std::multiset<bool>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_198._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_198._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_198._M_t._M_impl._0_8_ = 0;
  local_198._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::multiset
            (&local_198);
  jessilib::object::
  get<std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            (&local_160,(object *)&gtest_ar_.message_,&local_198);
  local_129 = std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::
              empty(&local_160);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::~multiset
            (&local_160);
  std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::~multiset
            (&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_128,
               "obj.get<std::multiset<signed char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_248._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_248._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_248._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_248._M_t._M_impl._0_8_ = 0;
  local_248._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_248._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::multiset
            (&local_248);
  jessilib::object::
  get<std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_210,(object *)&gtest_ar_.message_,&local_248);
  local_1d9 = std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
              ::empty(&local_210);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~multiset
            (&local_210);
  std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~multiset
            (&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_1d8,
               "obj.get<std::multiset<unsigned char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=(local_258,local_250);
    testing::internal::AssertHelper::~AssertHelper(local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2f8._M_t._M_impl._0_8_ = 0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<short,_std::less<short>,_std::allocator<short>_>::multiset(&local_2f8);
  jessilib::object::
  get<std::multiset<short,_std::less<short>,_std::allocator<short>_>,_std::multiset<short,_std::less<short>,_std::allocator<short>_>,_nullptr>
            (&local_2c0,(object *)&gtest_ar_.message_,&local_2f8);
  local_289 = std::multiset<short,_std::less<short>,_std::allocator<short>_>::empty(&local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  std::multiset<short,_std::less<short>,_std::allocator<short>_>::~multiset(&local_2c0);
  std::multiset<short,_std::less<short>,_std::allocator<short>_>::~multiset(&local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_288,
               "obj.get<std::multiset<short>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=(local_308,local_300);
    testing::internal::AssertHelper::~AssertHelper(local_308);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_3a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_3a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_3a8._M_t._M_impl._0_8_ = 0;
  local_3a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset(&local_3a8);
  jessilib::object::
  get<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>,_nullptr>
            (&local_370,(object *)&gtest_ar_.message_,&local_3a8);
  local_339 = std::multiset<int,_std::less<int>,_std::allocator<int>_>::empty(&local_370);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_338,&local_339,(type *)0x0);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_370);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_338,
               "obj.get<std::multiset<int>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=(local_3b8,local_3b0);
    testing::internal::AssertHelper::~AssertHelper(local_3b8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_458._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_458._M_t._M_impl._0_8_ = 0;
  local_458._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_458._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<long,_std::less<long>,_std::allocator<long>_>::multiset(&local_458);
  jessilib::object::
  get<std::multiset<long,_std::less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            (&local_420,(object *)&gtest_ar_.message_,&local_458);
  local_3e9 = std::multiset<long,_std::less<long>,_std::allocator<long>_>::empty(&local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
  std::multiset<long,_std::less<long>,_std::allocator<long>_>::~multiset(&local_420);
  std::multiset<long,_std::less<long>,_std::allocator<long>_>::~multiset(&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(local_460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__6.message_,local_3e8,
               "obj.get<std::multiset<long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=(local_468,local_460);
    testing::internal::AssertHelper::~AssertHelper(local_468);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  local_508._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_508._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_508._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_508._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_508._M_t._M_impl._0_8_ = 0;
  local_508._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_508._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>::multiset(&local_508);
  jessilib::object::
  get<std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_nullptr>
            (&local_4d0,(object *)&gtest_ar_.message_,&local_508);
  local_499 = std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>::empty
                        (&local_4d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_498,&local_499,(type *)0x0);
  std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~multiset(&local_4d0);
  std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~multiset(&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__7.message_,local_498,
               "obj.get<std::multiset<long long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=(local_518,local_510);
    testing::internal::AssertHelper::~AssertHelper(local_518);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  local_5b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_5b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_5b8._M_t._M_impl._0_8_ = 0;
  local_5b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<long,_std::less<long>,_std::allocator<long>_>::multiset(&local_5b8);
  jessilib::object::
  get<std::multiset<long,_std::less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            (&local_580,(object *)&gtest_ar_.message_,&local_5b8);
  local_549 = std::multiset<long,_std::less<long>,_std::allocator<long>_>::empty(&local_580);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,&local_549,(type *)0x0);
  std::multiset<long,_std::less<long>,_std::allocator<long>_>::~multiset(&local_580);
  std::multiset<long,_std::less<long>,_std::allocator<long>_>::~multiset(&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__8.message_,local_548,
               "obj.get<std::multiset<intmax_t>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=(local_5c8,local_5c0);
    testing::internal::AssertHelper::~AssertHelper(local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  local_668._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_668._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_668._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_668._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_668._M_t._M_impl._0_8_ = 0;
  local_668._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_668._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<float,_std::less<float>,_std::allocator<float>_>::multiset(&local_668);
  jessilib::object::
  get<std::multiset<float,_std::less<float>,_std::allocator<float>_>,_std::multiset<float,_std::less<float>,_std::allocator<float>_>,_nullptr>
            (&local_630,(object *)&gtest_ar_.message_,&local_668);
  local_5f9 = std::multiset<float,_std::less<float>,_std::allocator<float>_>::empty(&local_630);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  std::multiset<float,_std::less<float>,_std::allocator<float>_>::~multiset(&local_630);
  std::multiset<float,_std::less<float>,_std::allocator<float>_>::~multiset(&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__9.message_,local_5f8,
               "obj.get<std::multiset<float>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=(local_678,local_670);
    testing::internal::AssertHelper::~AssertHelper(local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_718._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_718._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_718._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_718._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_718._M_t._M_impl._0_8_ = 0;
  local_718._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_718._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<double,_std::less<double>,_std::allocator<double>_>::multiset(&local_718);
  jessilib::object::
  get<std::multiset<double,_std::less<double>,_std::allocator<double>_>,_std::multiset<double,_std::less<double>,_std::allocator<double>_>,_nullptr>
            (&local_6e0,(object *)&gtest_ar_.message_,&local_718);
  local_6a9 = std::multiset<double,_std::less<double>,_std::allocator<double>_>::empty(&local_6e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
  std::multiset<double,_std::less<double>,_std::allocator<double>_>::~multiset(&local_6e0);
  std::multiset<double,_std::less<double>,_std::allocator<double>_>::~multiset(&local_718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(local_720);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__10.message_,local_6a8,
               "obj.get<std::multiset<double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=(local_728,local_720);
    testing::internal::AssertHelper::~AssertHelper(local_728);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  local_7c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_7c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_7c8._M_t._M_impl._0_8_ = 0;
  local_7c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_7c8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>::multiset
            (&local_7c8);
  jessilib::object::
  get<std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_nullptr>
            (&local_790,(object *)&gtest_ar_.message_,&local_7c8);
  local_759 = std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>::
              empty(&local_790);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_758,&local_759,(type *)0x0);
  std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>::~multiset
            (&local_790);
  std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>::~multiset
            (&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar1) {
    testing::Message::Message(local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__11.message_,local_758,
               "obj.get<std::multiset<long double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=(local_7d8,local_7d0);
    testing::internal::AssertHelper::~AssertHelper(local_7d8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_878._M_t._M_impl._0_8_ = 0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::multiset(&local_878);
  jessilib::object::
  get<std::multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&local_840,(object *)&gtest_ar_.message_,&local_878);
  local_809 = std::
              multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ::empty(&local_840);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_808,&local_809,(type *)0x0);
  std::
  multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~multiset(&local_840);
  std::
  multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~multiset(&local_878);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__12.message_,local_808,
               "obj.get<std::multiset<std::u8string>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_888,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=(local_888,local_880);
    testing::internal::AssertHelper::~AssertHelper(local_888);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  local_928._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_928._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_928._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_928._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_928._M_t._M_impl._0_8_ = 0;
  local_928._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_928._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::
  multiset(&local_928);
  jessilib::object::
  get<std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_8f0,(object *)&gtest_ar_.message_,&local_928);
  local_8b9 = std::
              multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              ::empty(&local_8f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8b8,&local_8b9,(type *)0x0);
  std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::
  ~multiset(&local_8f0);
  std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::
  ~multiset(&local_928);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(local_930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_958,local_8b8,"obj.get<std::multiset<object>>().empty()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_958);
    testing::internal::AssertHelper::AssertHelper
              (local_938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=(local_938,local_930);
    testing::internal::AssertHelper::~AssertHelper(local_938);
    std::__cxx11::string::~string((string *)&local_958);
    testing::Message::~Message(local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  jessilib::object::~object((object *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_multiset) {
	object obj;

	EXPECT_TRUE(obj.get<std::multiset<bool>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<short>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<int>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long long>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<float>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<double>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long double>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<object>>().empty());
}